

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O1

Namer * __thiscall LiteScript::Namer::operator=(Namer *this,Namer *n)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer this_00;
  
  Nullable<LiteScript::Variable>::operator=(&this->current,&n->current);
  pVVar1 = (this->heap).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (this->heap).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pVVar1;
  if (pVVar2 != pVVar1) {
    do {
      Variable::~Variable(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pVVar2);
    (this->heap).super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator=
            (&this->heap,&n->heap);
  return this;
}

Assistant:

LiteScript::Namer& LiteScript::Namer::operator=(const Namer &n) {
    this->current = n.current;
    this->heap.clear();
    this->heap = n.heap;
    return *this;
}